

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void __thiscall dxil_spv::CFGStructurizer::build_reachability(CFGStructurizer *this)

{
  pointer puVar1;
  pointer ppCVar2;
  long lVar3;
  ulong uVar4;
  pointer ppCVar5;
  
  puVar1 = (this->reachability_bitset).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->forward_post_visit_order).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->forward_post_visit_order).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar4 = lVar3 + 0x1fU >> 5;
  this->reachability_stride = (uint)uVar4;
  if ((this->reachability_bitset).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->reachability_bitset).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::resize
            (&this->reachability_bitset,(uVar4 & 0xffffffff) * lVar3);
  ppCVar2 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar5 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2;
      ppCVar5 = ppCVar5 + 1) {
    visit_reachability(this,*ppCVar5);
  }
  return;
}

Assistant:

void CFGStructurizer::build_reachability()
{
	reachability_stride = (forward_post_visit_order.size() + 31) / 32;
	reachability_bitset.clear();
	reachability_bitset.resize(reachability_stride * forward_post_visit_order.size());
	for (auto *node : forward_post_visit_order)
		visit_reachability(*node);
}